

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dri(j_decompress_ptr cinfo)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  long *in_RDI;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  uint tmp;
  JLONG length;
  long local_38;
  byte *local_30;
  
  puVar2 = (undefined8 *)in_RDI[5];
  local_30 = (byte *)*puVar2;
  local_38 = puVar2[1];
  if (local_38 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = (byte *)*puVar2;
    local_38 = puVar2[1];
  }
  local_38 = local_38 + -1;
  bVar1 = *local_30;
  local_30 = local_30 + 1;
  if (local_38 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = (byte *)*puVar2;
    local_38 = puVar2[1];
  }
  local_38 = local_38 + -1;
  if ((ulong)*local_30 + (ulong)bVar1 * 0x100 != 4) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xb;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_30 = local_30 + 1;
  if (local_38 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = (byte *)*puVar2;
    local_38 = puVar2[1];
  }
  local_38 = local_38 + -1;
  bVar1 = *local_30;
  local_30 = local_30 + 1;
  if (local_38 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = (byte *)*puVar2;
    local_38 = puVar2[1];
  }
  iVar3 = (uint)*local_30 + (uint)bVar1 * 0x100;
  *(undefined4 *)(*in_RDI + 0x28) = 0x52;
  *(int *)(*in_RDI + 0x2c) = iVar3;
  (**(code **)(*in_RDI + 8))(in_RDI,1);
  *(int *)(in_RDI + 0x2e) = iVar3;
  *puVar2 = local_30 + 1;
  puVar2[1] = local_38 + -1;
  return 1;
}

Assistant:

LOCAL(boolean)
get_dri(j_decompress_ptr cinfo)
/* Process a DRI marker */
{
  JLONG length;
  unsigned int tmp;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);

  if (length != 4)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_2BYTES(cinfo, tmp, return FALSE);

  TRACEMS1(cinfo, 1, JTRC_DRI, tmp);

  cinfo->restart_interval = tmp;

  INPUT_SYNC(cinfo);
  return TRUE;
}